

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

double __thiscall
duckdb::Interpolator<false>::Extract<signed_char,double>
          (Interpolator<false> *this,char *dest,Vector *result)

{
  char cVar1;
  bool bVar2;
  InvalidInputException *pIVar3;
  char input;
  char input_00;
  char input_01;
  double dVar4;
  double result_1;
  double local_48;
  string local_40;
  double local_20;
  
  cVar1 = *dest;
  if (this->CRN == this->FRN) {
    bVar2 = TryCast::Operation<signed_char,double>(cVar1,&local_48,false);
    if (!bVar2) {
      pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<signed_char,double>(&local_40,(duckdb *)(ulong)(uint)(int)cVar1,input);
      InvalidInputException::InvalidInputException(pIVar3,&local_40);
      __cxa_throw(pIVar3,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    bVar2 = TryCast::Operation<signed_char,double>(cVar1,&local_48,false);
    if (!bVar2) {
      pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<signed_char,double>(&local_40,(duckdb *)(ulong)(uint)(int)cVar1,input_00);
      InvalidInputException::InvalidInputException(pIVar3,&local_40);
      __cxa_throw(pIVar3,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_20 = local_48;
    cVar1 = dest[1];
    bVar2 = TryCast::Operation<signed_char,double>(cVar1,&local_48,false);
    if (!bVar2) {
      pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<signed_char,double>(&local_40,(duckdb *)(ulong)(uint)(int)cVar1,input_01);
      InvalidInputException::InvalidInputException(pIVar3,&local_40);
      __cxa_throw(pIVar3,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    dVar4 = this->RN -
            (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0));
    local_48 = dVar4 * local_48 + local_20 * (1.0 - dVar4);
  }
  return local_48;
}

Assistant:

inline TARGET_TYPE Extract(const INPUT_TYPE *dest, Vector &result) const {
		if (CRN == FRN) {
			return CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[0], result);
		} else {
			auto lo = CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[0], result);
			auto hi = CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[1], result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}